

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

ncnn_modelbin_t ncnn_modelbin_create_from_datareader(ncnn_datareader_t dr)

{
  ncnn_modelbin_t this;
  void *pvVar1;
  ncnn_modelbin_t mb;
  DataReader *in_stack_ffffffffffffffe0;
  ncnn_modelbin_t in_stack_ffffffffffffffe8;
  
  this = (ncnn_modelbin_t)malloc(0x20);
  pvVar1 = operator_new(0x18);
  ModelBinFromDataReader_c_api::ModelBinFromDataReader_c_api
            ((ModelBinFromDataReader_c_api *)this,in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe0);
  this->pthis = pvVar1;
  this->load_1d = __ncnn_ModelBinFromDataReader_load_1d;
  this->load_2d = __ncnn_ModelBinFromDataReader_load_2d;
  this->load_3d = __ncnn_ModelBinFromDataReader_load_3d;
  return this;
}

Assistant:

ncnn_modelbin_t ncnn_modelbin_create_from_datareader(const ncnn_datareader_t dr)
{
    ncnn_modelbin_t mb = (ncnn_modelbin_t)malloc(sizeof(struct __ncnn_modelbin_t));
    mb->pthis = (void*)(new ModelBinFromDataReader_c_api(mb, *(const DataReader*)dr->pthis));
    mb->load_1d = __ncnn_ModelBinFromDataReader_load_1d;
    mb->load_2d = __ncnn_ModelBinFromDataReader_load_2d;
    mb->load_3d = __ncnn_ModelBinFromDataReader_load_3d;
    return mb;
}